

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::BaseTimeCoordinator::BaseTimeCoordinator(BaseTimeCoordinator *this)

{
  TimeDependencies *in_RDI;
  function<void_(const_helics::ActionMessage_&)> *unaff_retaddr;
  TimeDependencies *__f;
  
  (in_RDI->dependencies).
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__BaseTimeCoordinator_00a53600;
  __f = in_RDI;
  TimeDependencies::TimeDependencies(in_RDI);
  std::function<void(helics::ActionMessage_const&)>::function<helics::__1&,void>
            (unaff_retaddr,(anon_class_1_0_00000001 *)__f);
  GlobalFederateId::GlobalFederateId
            ((GlobalFederateId *)
             &in_RDI[2].dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish,0);
  *(undefined4 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined1 *)
   &in_RDI[2].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 1;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  return;
}

Assistant:

BaseTimeCoordinator::BaseTimeCoordinator(): sendMessageFunction(nullMessageFunction) {}